

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O0

void __thiscall
phyr::SurfaceInteraction::SurfaceInteraction
          (SurfaceInteraction *this,Point3f *p,Vector3f *wo,Vector3f *pfError,Point2f *uv,
          Vector3f *dpdu,Vector3f *dpdv,Normal3f *dndu,Normal3f *dndv,Shape *shape)

{
  Vector3f *in_RCX;
  Vector3f *in_RDX;
  Point3f *in_RSI;
  anon_struct_128_6_d0712383_for_shadingGeom *in_RDI;
  double *in_R8;
  double *in_R9;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double in_stack_00000020;
  double local_a8;
  Normal3<double> *in_stack_ffffffffffffff60;
  double local_98;
  double local_90;
  Vector3<double> *in_stack_ffffffffffffff78;
  Vector3<double> *in_stack_ffffffffffffff80;
  Vector3<double> local_78;
  Normal3<double> local_60;
  Normal3f local_48;
  double *local_30;
  double *local_28;
  Vector3f *local_20;
  Vector3f *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  cross<double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Normal3<double>::Normal3(&local_60,&local_78);
  normalize<double>(in_stack_ffffffffffffff60);
  Interaction::Interaction((Interaction *)in_RDI,in_RSI,&local_48,local_18,local_20);
  (in_RDI->dndv).x = *local_28;
  (in_RDI->dndv).y = local_28[1];
  (in_RDI->dndv).z = *local_30;
  *(double *)&in_RDI->overridesOrientation = local_30[1];
  in_RDI[1].n.x = local_30[2];
  in_RDI[1].n.y = *in_stack_00000008;
  in_RDI[1].n.z = in_stack_00000008[1];
  in_RDI[1].dpdu.x = in_stack_00000008[2];
  in_RDI[1].dpdu.y = *in_stack_00000010;
  in_RDI[1].dpdu.z = in_stack_00000010[1];
  in_RDI[1].dpdv.x = in_stack_00000010[2];
  in_RDI[1].dpdv.y = *in_stack_00000018;
  in_RDI[1].dpdv.z = in_stack_00000018[1];
  in_RDI[1].dndu.x = in_stack_00000018[2];
  in_RDI[1].dndu.y = 0.0;
  in_RDI[1].dndu.z = in_stack_00000020;
  in_RDI[1].dndv.x = 0.0;
  Vector3<double>::Vector3((Vector3<double> *)&in_RDI[1].dndv.y);
  Vector3<double>::Vector3((Vector3<double> *)(in_RDI + 2));
  in_RDI[2].dpdu.x = 0.0;
  in_RDI[2].dpdu.y = 0.0;
  in_RDI[2].dpdu.z = 0.0;
  in_RDI[2].dpdv.x = 0.0;
  {unnamed_type#1}::SurfaceInteraction(in_RDI);
  in_RDI[2].dpdv.y = (in_RDI->dpdu).x;
  in_RDI[2].dpdv.z = (in_RDI->dpdu).y;
  in_RDI[2].dndu.x = (in_RDI->dpdu).z;
  in_RDI[2].dndu.y = *local_30;
  in_RDI[2].dndu.z = local_30[1];
  in_RDI[2].dndv.x = local_30[2];
  in_RDI[2].dndv.y = *in_stack_00000008;
  in_RDI[2].dndv.z = in_stack_00000008[1];
  *(double *)&in_RDI[2].overridesOrientation = in_stack_00000008[2];
  in_RDI[3].n.x = *in_stack_00000010;
  in_RDI[3].n.y = in_stack_00000010[1];
  in_RDI[3].n.z = in_stack_00000010[2];
  in_RDI[3].dpdu.x = *in_stack_00000018;
  in_RDI[3].dpdu.y = in_stack_00000018[1];
  in_RDI[3].dpdu.z = in_stack_00000018[2];
  *(undefined1 *)&in_RDI[3].dpdv.x = 0;
  if ((in_stack_00000020 != 0.0) &&
     ((*(byte *)((long)in_stack_00000020 + 0x18) & 1) !=
      (*(byte *)((long)in_stack_00000020 + 0x19) & 1))) {
    Normal3<double>::operator-(&in_RDI->n);
    (in_RDI->dpdu).x = local_90;
    (in_RDI->dpdu).y = (double)in_stack_ffffffffffffff78;
    (in_RDI->dpdu).z = (double)in_stack_ffffffffffffff80;
    Normal3<double>::operator-(&in_RDI->n);
    in_RDI[2].dpdv.y = local_a8;
    in_RDI[2].dpdv.z = (double)in_stack_ffffffffffffff60;
    in_RDI[2].dndu.x = local_98;
  }
  return;
}

Assistant:

SurfaceInteraction::SurfaceInteraction(const Point3f& p,
                   const Vector3f& wo, const Vector3f& pfError,
                   const Point2f& uv, const Vector3f& dpdu, const Vector3f& dpdv,
                   const Normal3f& dndu, const Normal3f& dndv, const Shape* shape) :
    Interaction(p, normalize(Normal3f(cross(dpdu, dpdv))), wo, pfError), uv(uv), dpdu(dpdu),
    dpdv(dpdv), dndu(dndu), dndv(dndv), shape(shape) {
    // Initialize shading geometry from true geometry
    shadingGeom.n = n;
    shadingGeom.dpdu = dpdu; shadingGeom.dpdv = dpdv;
    shadingGeom.dndu = dndu; shadingGeom.dndv = dndv;
    shadingGeom.overridesOrientation = false;

    // Adjust normals if either shape assumes reversed normals
    // or shape transformation changes coordinate system but not both
    if (shape && (shape->reverseNormals ^ shape->transformChangesCoordSys)) {
        // Flip normals
        n = -n; shadingGeom.n = -shadingGeom.n;
    }
}